

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_io.c
# Opt level: O2

ssize_t tnt_io_sendv(tnt_stream_net *s,iovec *iov,int count)

{
  char *buf;
  size_t size;
  long lVar1;
  ssize_t sVar2;
  ulong uVar3;
  ulong uVar4;
  
  buf = (s->sbuf).buf;
  if (buf == (char *)0x0) {
    sVar2 = tnt_io_sendv_raw(s,iov,count,1);
    return sVar2;
  }
  lVar1 = 0;
  uVar3 = 0;
  if (0 < count) {
    uVar3 = (ulong)(uint)count;
  }
  uVar4 = 0;
  for (; uVar3 * 0x10 != lVar1; lVar1 = lVar1 + 0x10) {
    uVar4 = uVar4 + *(long *)((long)&iov->iov_len + lVar1);
  }
  uVar3 = (s->sbuf).size;
  if (uVar3 < uVar4) {
    s->error = TNT_EBIG;
LAB_00107143:
    uVar4 = 0xffffffffffffffff;
  }
  else {
    size = (s->sbuf).off;
    if (uVar3 < size + uVar4) {
      sVar2 = tnt_io_send_raw(s,buf,size,1);
      if (sVar2 == -1) goto LAB_00107143;
      (s->sbuf).off = 0;
    }
    tnt_io_sendv_put(s,iov,count);
  }
  return uVar4;
}

Assistant:

ssize_t
tnt_io_sendv(struct tnt_stream_net *s, struct iovec *iov, int count)
{
	if (s->sbuf.buf == NULL)
		return tnt_io_sendv_raw(s, iov, count, 1);
	size_t size = 0;
	int i;
	for (i = 0 ; i < count ; i++)
		size += iov[i].iov_len;
	if (size > s->sbuf.size) {
		s->error = TNT_EBIG;
		return -1;
	}
	if ((s->sbuf.off + size) <= s->sbuf.size) {
		tnt_io_sendv_put(s, iov, count);
		return size;
	}
	ssize_t r = tnt_io_send_raw(s, s->sbuf.buf, s->sbuf.off, 1);
	if (r == -1)
		return -1;
	s->sbuf.off = 0;
	tnt_io_sendv_put(s, iov, count);
	return size;
}